

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

void combine(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> *views,char *outname,bool override)

{
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  pointer pHVar4;
  pointer pHVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  size_t __n;
  char cVar8;
  int iVar9;
  int iVar10;
  MultiPartInputFile *pMVar11;
  Header *pHVar12;
  long *plVar13;
  ostream *poVar14;
  invalid_argument *this;
  undefined7 in_register_00000009;
  long lVar15;
  ulong uVar16;
  bool forcepartname;
  int partnum;
  MultiPartInputFile *infile;
  vector<int,_std::allocator<int>_> partnums;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> inputs;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> fordelete;
  MultiPartOutputFile out;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  MultiPartOutputFile temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  Header h;
  bool local_311;
  int local_310;
  int local_30c;
  MultiPartInputFile *local_308;
  allocator<char> local_2f9;
  int *local_2f8;
  iterator iStack_2f0;
  int *local_2e8;
  MultiPartInputFile **local_2d8;
  iterator iStack_2d0;
  MultiPartInputFile **local_2c8;
  MultiPartInputFile **local_2b8;
  iterator iStack_2b0;
  MultiPartInputFile **local_2a8;
  string local_298;
  long *local_278 [2];
  long local_268 [2];
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_258;
  undefined4 local_23c;
  string local_238;
  ulong local_218;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  char *local_1e8;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_1e0;
  long local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [47];
  
  local_23c = (undefined4)CONCAT71(in_register_00000009,override);
  ppcVar1 = (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_218 = (long)ppcVar1 - (long)ppcVar2 >> 3;
  local_2e8 = (int *)0x0;
  local_2f8 = (int *)0x0;
  iStack_2f0._M_current = (int *)0x0;
  local_2c8 = (MultiPartInputFile **)0x0;
  local_2d8 = (MultiPartInputFile **)0x0;
  iStack_2d0._M_current = (MultiPartInputFile **)0x0;
  local_2a8 = (MultiPartInputFile **)0x0;
  local_2b8 = (MultiPartInputFile **)0x0;
  iStack_2b0._M_current = (MultiPartInputFile **)0x0;
  local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210 = views;
  local_1e8 = outname;
  if (ppcVar1 != ppcVar2) {
    local_1d8 = local_218 + (local_218 == 0);
    lVar15 = 0;
    local_1e0 = in;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,
                 (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar15],(allocator<char> *)&local_1b8);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      parse_filename(&local_238,&local_298,&local_311,&local_30c);
      if (local_30c == -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_208,&local_238);
        pMVar11 = (MultiPartInputFile *)operator_new(0x20);
        _Var6._M_p = local_238._M_dataplus._M_p;
        iVar9 = Imf_3_4::globalThreadCount();
        Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar11,_Var6._M_p,iVar9,true);
        local_308 = pMVar11;
        if (iStack_2b0._M_current == local_2a8) {
          std::vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>::
          _M_realloc_insert<Imf_3_4::MultiPartInputFile*const&>
                    ((vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>
                      *)&local_2b8,iStack_2b0,&local_308);
        }
        else {
          *iStack_2b0._M_current = pMVar11;
          iStack_2b0._M_current = iStack_2b0._M_current + 1;
        }
        iVar9 = Imf_3_4::MultiPartInputFile::parts();
        bVar3 = local_311;
        local_310 = 0;
        in = local_1e0;
        if (0 < iVar9) {
          do {
            if (iStack_2d0._M_current == local_2c8) {
              std::vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>
              ::_M_realloc_insert<Imf_3_4::MultiPartInputFile*const&>
                        ((vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>
                          *)&local_2d8,iStack_2d0,&local_308);
            }
            else {
              *iStack_2d0._M_current = local_308;
              iStack_2d0._M_current = iStack_2d0._M_current + 1;
            }
            pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_308);
            Imf_3_4::Header::Header((Header *)&local_1b8,pHVar12);
            cVar8 = Imf_3_4::Header::hasName();
            if ((cVar8 == '\0') || ((bVar3 & 1U) != 0)) {
              Imf_3_4::Header::setName((string *)&local_1b8);
            }
            std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                      (&local_258,(Header *)&local_1b8);
            pHVar4 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppcVar1 = (local_210->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if (ppcVar1[lVar15] != (char *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_278,ppcVar1[lVar15],&local_2f9);
              Imf_3_4::Header::setView((string *)(pHVar4 + -0x38));
              if (local_278[0] != local_268) {
                operator_delete(local_278[0],local_268[0] + 1);
              }
            }
            if (iStack_2f0._M_current == local_2e8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_2f8,iStack_2f0,&local_310);
            }
            else {
              *iStack_2f0._M_current = local_310;
              iStack_2f0._M_current = iStack_2f0._M_current + 1;
            }
            Imf_3_4::Header::~Header((Header *)&local_1b8);
            local_310 = local_310 + 1;
            in = local_1e0;
          } while (local_310 < iVar9);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_208,&local_238);
        pMVar11 = (MultiPartInputFile *)operator_new(0x20);
        _Var6._M_p = local_238._M_dataplus._M_p;
        iVar9 = Imf_3_4::globalThreadCount();
        Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar11,_Var6._M_p,iVar9,true);
        local_308 = pMVar11;
        if (iStack_2b0._M_current == local_2a8) {
          std::vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>::
          _M_realloc_insert<Imf_3_4::MultiPartInputFile*const&>
                    ((vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>
                      *)&local_2b8,iStack_2b0,&local_308);
        }
        else {
          *iStack_2b0._M_current = pMVar11;
          iStack_2b0._M_current = iStack_2b0._M_current + 1;
        }
        iVar9 = local_30c;
        iVar10 = Imf_3_4::MultiPartInputFile::parts();
        if (iVar10 <= iVar9) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"You asked for part ",0x13);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_30c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," in ",4);
          poVar14 = std::operator<<(poVar14,(in->
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start[lVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", which only has ",0x11);
          iVar9 = Imf_3_4::MultiPartInputFile::parts();
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," parts",6);
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::invalid_argument::invalid_argument(this,(string *)local_278);
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        if (iStack_2d0._M_current == local_2c8) {
          std::vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>::
          _M_realloc_insert<Imf_3_4::MultiPartInputFile*const&>
                    ((vector<Imf_3_4::MultiPartInputFile*,std::allocator<Imf_3_4::MultiPartInputFile*>>
                      *)&local_2d8,iStack_2d0,&local_308);
        }
        else {
          *iStack_2d0._M_current = local_308;
          iStack_2d0._M_current = iStack_2d0._M_current + 1;
        }
        pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_308);
        Imf_3_4::Header::Header((Header *)&local_1b8,pHVar12);
        cVar8 = Imf_3_4::Header::hasName();
        if ((cVar8 == '\0') || (local_311 == true)) {
          Imf_3_4::Header::setName((string *)&local_1b8);
        }
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                  (&local_258,(Header *)&local_1b8);
        pHVar4 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        ppcVar1 = (local_210->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppcVar1[lVar15] != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278,ppcVar1[lVar15],(allocator<char> *)&local_310);
          Imf_3_4::Header::setView((string *)(pHVar4 + -0x38));
          if (local_278[0] != local_268) {
            operator_delete(local_278[0],local_268[0] + 1);
          }
        }
        if (iStack_2f0._M_current == local_2e8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_2f8,iStack_2f0,&local_30c);
        }
        else {
          *iStack_2f0._M_current = local_30c;
          iStack_2f0._M_current = iStack_2f0._M_current + 1;
        }
        Imf_3_4::Header::~Header((Header *)&local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d0,&local_208);
  pcVar7 = local_1e8;
  filename_check(&local_1d0,local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  if (1 < local_218) {
    make_unique_names(&local_258);
  }
  pHVar5 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar4 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = Imf_3_4::globalThreadCount();
  bVar3 = local_23c._0_1_;
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&local_238,pcVar7,pHVar4,
             (int)((ulong)((long)pHVar5 - (long)pHVar4) >> 3) * -0x49249249,local_23c._0_1_,iVar9);
  pHVar5 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar4 = local_258.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&local_298,pcVar7,pHVar4,
             (int)((ulong)((long)pHVar5 - (long)pHVar4) >> 3) * -0x49249249,bVar3,iVar9);
  if (iStack_2f0._M_current != local_2f8) {
    uVar16 = 0;
    do {
      plVar13 = (long *)Imf_3_4::Header::type_abi_cxx11_();
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,*plVar13,plVar13[1] + *plVar13)
      ;
      __n = local_1b0;
      iVar9 = (int)uVar16;
      if ((local_1b0 == _DAT_00110390) &&
         ((local_1b0 == 0 ||
          (iVar10 = bcmp(local_1b8,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,local_1b0), iVar10 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part ",5);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"scanlineimage",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        copy_scanline(local_2d8[uVar16],(MultiPartOutputFile *)&local_298,local_2f8[uVar16],iVar9);
      }
      else if ((__n == DAT_001103b0) &&
              ((__n == 0 ||
               (iVar10 = bcmp(local_1b8,Imf_3_4::TILEDIMAGE_abi_cxx11_,__n), iVar10 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part ",5);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"tiledimage",10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        copy_tile(local_2d8[uVar16],(MultiPartOutputFile *)&local_298,local_2f8[uVar16],iVar9);
      }
      else if ((__n == DAT_001103d0) &&
              ((__n == 0 ||
               (iVar10 = bcmp(local_1b8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n), iVar10 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part ",5);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"deepscanlineimage",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        copy_scanlinedeep(local_2d8[uVar16],(MultiPartOutputFile *)&local_298,local_2f8[uVar16],
                          iVar9);
      }
      else if ((__n == DAT_001103f0) &&
              ((__n == 0 || (iVar10 = bcmp(local_1b8,Imf_3_4::DEEPTILE_abi_cxx11_,__n), iVar10 == 0)
               ))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part ",5);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"deeptile",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        copy_tiledeep(local_2d8[uVar16],(MultiPartOutputFile *)&local_298,local_2f8[uVar16],iVar9);
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)iStack_2f0._M_current - (long)local_2f8 >> 2));
  }
  if (iStack_2b0._M_current != local_2b8) {
    uVar16 = 0;
    do {
      pMVar11 = local_2b8[uVar16];
      if (pMVar11 != (MultiPartInputFile *)0x0) {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pMVar11 + 0x18) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pMVar11 + 0x18));
        }
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pMVar11 + 8) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pMVar11 + 8));
        }
        operator_delete(pMVar11,0x20);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)iStack_2b0._M_current - (long)local_2b8 >> 3));
  }
  if (iStack_2d0._M_current != local_2d8) {
    iStack_2d0._M_current = local_2d8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Combine Success",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_298);
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_258);
  if (local_2b8 != (MultiPartInputFile **)0x0) {
    operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  if (local_2d8 != (MultiPartInputFile **)0x0) {
    operator_delete(local_2d8,(long)local_2c8 - (long)local_2d8);
  }
  if (local_2f8 != (int *)0x0) {
    operator_delete(local_2f8,(long)local_2e8 - (long)local_2f8);
  }
  return;
}

Assistant:

void
combine (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    size_t                      numInputs = in.size ();
    int                         numparts;
    vector<int>                 partnums;
    vector<MultiPartInputFile*> inputs;
    vector<MultiPartInputFile*> fordelete;
    MultiPartInputFile*         infile;
    vector<Header>              headers;
    vector<string>              fornamecheck;

    //
    // parse all inputs
    //

    // Input format :
    // We support the following syntax for each input
    // <file>[:<partnum>][::<newpartname>]

    for (size_t i = 0; i < numInputs; i++)
    {
        string filename (in[i]);
        string partname;
        bool   forcepartname;
        int    partnum;
        parse_filename (filename, partname, forcepartname, partnum);

        if (partnum == -1)
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);
            numparts = infile->parts ();

            //copy header from all parts of input to our header array
            for (int j = 0; j < numparts; j++)
            {
                inputs.push_back (infile);

                Header h = infile->header (j);
                if (!h.hasName () || forcepartname) h.setName (partname);

                headers.push_back (h);

                if (views[i] != NULL)
                    headers[headers.size () - 1].setView (views[i]);

                partnums.push_back (j);
            }
        } // no user parts specified
        else
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);

            if (partnum >= infile->parts ())
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << in[i]
                  << ", which only has " << infile->parts () << " parts";
                throw invalid_argument (e.str ());
            }
            //copy header from required part of input to our header array
            inputs.push_back (infile);

            Header h = infile->header (partnum);
            if (!h.hasName () || forcepartname) h.setName (partname);

            headers.push_back (h);

            if (views[i] != NULL)
                headers[headers.size () - 1].setView (views[i]);

            partnums.push_back (partnum);
        } // user parts specified
    }

    filename_check (fornamecheck, outname);
    //
    // sort out names - make unique
    //
    if (numInputs > 1) { make_unique_names (headers); }

    //
    // do combine
    //

    // early bail if need be
    MultiPartOutputFile temp (outname, &headers[0], headers.size (), override);

    MultiPartOutputFile out (outname, &headers[0], headers.size (), override);

    for (size_t p = 0; p < partnums.size (); p++)
    {
        std::string type = headers[p].type ();
        if (type == SCANLINEIMAGE)
        {
            cout << "part " << p << ": "
                 << "scanlineimage" << endl;
            copy_scanline (*inputs[p], out, partnums[p], p);
        }
        else if (type == TILEDIMAGE)
        {
            cout << "part " << p << ": "
                 << "tiledimage" << endl;
            copy_tile (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPSCANLINE)
        {
            cout << "part " << p << ": "
                 << "deepscanlineimage" << endl;
            copy_scanlinedeep (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPTILE)
        {
            cout << "part " << p << ": "
                 << "deeptile" << endl;
            copy_tiledeep (*inputs[p], out, partnums[p], p);
        }
    }

    for (size_t k = 0; k < fordelete.size (); k++)
    {
        delete fordelete[k];
    }

    inputs.clear ();

    cout << "\n"
         << "Combine Success" << endl;
}